

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_3chan_interleave_rev(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  exr_coding_channel_info_t *peVar5;
  uint uVar6;
  int iVar7;
  uint16_t *puVar8;
  long lVar9;
  uint16_t *puVar10;
  uint8_t *puVar11;
  float fVar12;
  
  peVar5 = decode->channels;
  uVar1 = peVar5->width;
  iVar2 = (decode->chunk).height;
  iVar3 = decode->user_line_end_ignore;
  iVar4 = peVar5->user_line_stride;
  puVar11 = peVar5[2].field_12.decode_to_ptr;
  iVar7 = decode->user_line_begin_skip;
  puVar8 = (uint16_t *)((long)(int)(uVar1 * 6 * iVar7) + (long)decode->unpacked_buffer);
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
  }
  for (; iVar7 < iVar2 - iVar3; iVar7 = iVar7 + 1) {
    puVar10 = puVar8;
    for (lVar9 = 0; (ulong)uVar6 * 6 - lVar9 != 0; lVar9 = lVar9 + 6) {
      fVar12 = half_to_float(puVar10[(long)(int)uVar1 * 2]);
      *(float *)(puVar11 + lVar9 * 2) = fVar12;
      fVar12 = half_to_float(puVar10[(int)uVar1]);
      *(float *)(puVar11 + lVar9 * 2 + 4) = fVar12;
      fVar12 = half_to_float(*puVar10);
      *(float *)(puVar11 + lVar9 * 2 + 8) = fVar12;
      puVar10 = puVar10 + 1;
    }
    puVar8 = (uint16_t *)((long)puVar8 + (long)(int)(uVar1 * 6));
    puVar11 = puVar11 + iVar4;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave_rev (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    /* interleaving case, we can do this! */
    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in2[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in0[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}